

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O1

int read_av1config(uint8_t *buffer,size_t buffer_length,size_t *bytes_read,Av1Config *config)

{
  uint uVar1;
  size_t sVar2;
  char *__format;
  int result;
  aom_read_bit_buffer reader_instance;
  int local_4c;
  aom_read_bit_buffer local_48;
  
  if ((config != (Av1Config *)0x0 && 3 < buffer_length) &&
      (bytes_read != (size_t *)0x0 && buffer != (uint8_t *)0x0)) {
    *bytes_read = 0;
    local_48.error_handler_data = &local_4c;
    local_4c = 0;
    local_48.bit_buffer_end = buffer + buffer_length;
    local_48.bit_offset = 0;
    local_48.error_handler = bitreader_error_handler;
    config->high_bitdepth = '\0';
    config->twelve_bit = '\0';
    config->monochrome = '\0';
    config->chroma_subsampling_x = '\0';
    config->chroma_subsampling_y = '\0';
    config->chroma_sample_position = '\0';
    config->initial_presentation_delay_present = '\0';
    config->initial_presentation_delay_minus_one = '\0';
    config->marker = '\0';
    config->version = '\0';
    config->seq_profile = '\0';
    config->seq_level_idx_0 = '\0';
    config->seq_tier_0 = '\0';
    config->high_bitdepth = '\0';
    config->twelve_bit = '\0';
    config->monochrome = '\0';
    local_48.bit_buffer = buffer;
    uVar1 = aom_rb_read_bit(&local_48);
    if (local_4c == -1) {
      __format = "av1c: Error reading bit for marker, value=%d result=%d.\n";
    }
    else {
      config->marker = (uint8_t)uVar1;
      uVar1 = aom_rb_read_literal(&local_48,7);
      if (local_4c == -1) {
        __format = "av1c: Could not read bits for version, value=%d result=%d.\n";
      }
      else {
        config->version = (uint8_t)uVar1;
        uVar1 = aom_rb_read_literal(&local_48,3);
        if (local_4c == -1) {
          __format = "av1c: Could not read bits for seq_profile, value=%d result=%d.\n";
        }
        else {
          config->seq_profile = (uint8_t)uVar1;
          uVar1 = aom_rb_read_literal(&local_48,5);
          if (local_4c == -1) {
            __format = "av1c: Could not read bits for seq_level_idx_0, value=%d result=%d.\n";
          }
          else {
            config->seq_level_idx_0 = (uint8_t)uVar1;
            uVar1 = aom_rb_read_bit(&local_48);
            if (local_4c == -1) {
              __format = "av1c: Error reading bit for seq_tier_0, value=%d result=%d.\n";
            }
            else {
              config->seq_tier_0 = (uint8_t)uVar1;
              uVar1 = aom_rb_read_bit(&local_48);
              if (local_4c == -1) {
                __format = "av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n";
              }
              else {
                config->high_bitdepth = (uint8_t)uVar1;
                uVar1 = aom_rb_read_bit(&local_48);
                if (local_4c == -1) {
                  __format = "av1c: Error reading bit for twelve_bit, value=%d result=%d.\n";
                }
                else {
                  config->twelve_bit = (uint8_t)uVar1;
                  uVar1 = aom_rb_read_bit(&local_48);
                  if (local_4c == -1) {
                    __format = "av1c: Error reading bit for monochrome, value=%d result=%d.\n";
                  }
                  else {
                    config->monochrome = (uint8_t)uVar1;
                    uVar1 = aom_rb_read_bit(&local_48);
                    if (local_4c == -1) {
                      __format = 
                      "av1c: Error reading bit for chroma_subsampling_x, value=%d result=%d.\n";
                    }
                    else {
                      config->chroma_subsampling_x = (uint8_t)uVar1;
                      uVar1 = aom_rb_read_bit(&local_48);
                      if (local_4c == -1) {
                        __format = 
                        "av1c: Error reading bit for chroma_subsampling_y, value=%d result=%d.\n";
                      }
                      else {
                        config->chroma_subsampling_y = (uint8_t)uVar1;
                        uVar1 = aom_rb_read_literal(&local_48,2);
                        if (local_4c == -1) {
                          __format = 
                          "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n"
                          ;
                        }
                        else {
                          config->chroma_sample_position = (uint8_t)uVar1;
                          uVar1 = aom_rb_read_literal(&local_48,3);
                          if (local_4c == -1) {
                            __format = 
                            "av1c: Could not read bits for reserved, value=%d result=%d.\n";
                          }
                          else {
                            uVar1 = aom_rb_read_bit(&local_48);
                            if (local_4c == -1) {
                              __format = 
                              "av1c: Error reading bit for initial_presentation_delay_present, value=%d result=%d.\n"
                              ;
                            }
                            else {
                              config->initial_presentation_delay_present = (uint8_t)uVar1;
                              uVar1 = aom_rb_read_literal(&local_48,4);
                              if (local_4c != -1) {
                                config->initial_presentation_delay_minus_one = (uint8_t)uVar1;
                                sVar2 = aom_rb_bytes_read(&local_48);
                                *bytes_read = sVar2;
                                return 0;
                              }
                              __format = 
                              "av1c: Could not read bits for initial_presentation_delay_minus_one, value=%d result=%d.\n"
                              ;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fprintf(_stderr,__format,(ulong)uVar1,0xffffffff);
  }
  return -1;
}

Assistant:

int read_av1config(const uint8_t *buffer, size_t buffer_length,
                   size_t *bytes_read, Av1Config *config) {
  if (!buffer || buffer_length < kAv1cSize || !bytes_read || !config) return -1;

  *bytes_read = 0;

  int result = 0;
  struct aom_read_bit_buffer reader_instance = { buffer, buffer + buffer_length,
                                                 0, &result,
                                                 bitreader_error_handler };
  struct aom_read_bit_buffer *reader = &reader_instance;

  memset(config, 0, sizeof(*config));

  AV1C_READ_BIT_OR_RETURN_ERROR(marker);
  config->marker = marker;

  AV1C_READ_BITS_OR_RETURN_ERROR(version, 7);
  config->version = version;

  AV1C_READ_BITS_OR_RETURN_ERROR(seq_profile, 3);
  config->seq_profile = seq_profile;

  AV1C_READ_BITS_OR_RETURN_ERROR(seq_level_idx_0, 5);
  config->seq_level_idx_0 = seq_level_idx_0;

  AV1C_READ_BIT_OR_RETURN_ERROR(seq_tier_0);
  config->seq_tier_0 = seq_tier_0;

  AV1C_READ_BIT_OR_RETURN_ERROR(high_bitdepth);
  config->high_bitdepth = high_bitdepth;

  AV1C_READ_BIT_OR_RETURN_ERROR(twelve_bit);
  config->twelve_bit = twelve_bit;

  AV1C_READ_BIT_OR_RETURN_ERROR(monochrome);
  config->monochrome = monochrome;

  AV1C_READ_BIT_OR_RETURN_ERROR(chroma_subsampling_x);
  config->chroma_subsampling_x = chroma_subsampling_x;

  AV1C_READ_BIT_OR_RETURN_ERROR(chroma_subsampling_y);
  config->chroma_subsampling_y = chroma_subsampling_y;

  AV1C_READ_BITS_OR_RETURN_ERROR(chroma_sample_position, 2);
  config->chroma_sample_position = chroma_sample_position;

  AV1C_READ_BITS_OR_RETURN_ERROR(reserved, 3);

  AV1C_READ_BIT_OR_RETURN_ERROR(initial_presentation_delay_present);
  config->initial_presentation_delay_present =
      initial_presentation_delay_present;

  AV1C_READ_BITS_OR_RETURN_ERROR(initial_presentation_delay_minus_one, 4);
  config->initial_presentation_delay_minus_one =
      initial_presentation_delay_minus_one;

  *bytes_read = aom_rb_bytes_read(reader);

  return 0;
}